

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseSetPair<llbuild::core::CancellationDelegate_*> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
::InsertIntoBucketImpl<llbuild::core::CancellationDelegate*>
          (DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
           *this,CancellationDelegate **Key,CancellationDelegate **Lookup,
          DenseSetPair<llbuild::core::CancellationDelegate_*> *TheBucket)

{
  bool bVar1;
  uint uVar2;
  uint AtLeast;
  uint uVar3;
  CancellationDelegate *RHS;
  CancellationDelegate **ppCVar4;
  CancellationDelegate *EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *TheBucket_local;
  CancellationDelegate **Lookup_local;
  CancellationDelegate **Key_local;
  DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)Lookup;
  Lookup_local = Key;
  Key_local = (CancellationDelegate **)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar2 = DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
          ::getNumEntries((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                           *)this);
  AtLeast = DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
            ::getNumBuckets((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                             *)this);
  if ((uVar2 + 1) * 4 < AtLeast * 3) {
    uVar3 = DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
            ::getNumTombstones((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                                *)this);
    if (AtLeast - (uVar2 + 1 + uVar3) <= AtLeast >> 3) {
      DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
      ::grow((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
              *)this,AtLeast);
      LookupBucketFor<llbuild::core::CancellationDelegate*>
                (this,&TheBucket_local->key,
                 (DenseSetPair<llbuild::core::CancellationDelegate_*> **)&NumBuckets);
    }
  }
  else {
    DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
    ::grow((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
            *)this,AtLeast << 1);
    LookupBucketFor<llbuild::core::CancellationDelegate*>
              (this,&TheBucket_local->key,
               (DenseSetPair<llbuild::core::CancellationDelegate_*> **)&NumBuckets);
    DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
    ::getNumBuckets((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                     *)this);
  }
  if (_NumBuckets == (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x22a,
                  "BucketT *llvm::DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, BucketT = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, LookupKeyT = llbuild::core::CancellationDelegate *]"
                 );
  }
  DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  ::incrementNumEntries
            ((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
              *)this);
  RHS = DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
        ::getEmptyKey();
  ppCVar4 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(_NumBuckets);
  bVar1 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual(*ppCVar4,RHS);
  if (!bVar1) {
    DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
    ::decrementNumTombstones
              ((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                *)this);
  }
  return _NumBuckets;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }